

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kit.h
# Opt level: O0

void Kit_TruthMuxPhase(uint *pOut,uint *pIn0,uint *pIn1,uint *pCtrl,int nVars,int fComp0)

{
  int local_34;
  int w;
  int fComp0_local;
  int nVars_local;
  uint *pCtrl_local;
  uint *pIn1_local;
  uint *pIn0_local;
  uint *pOut_local;
  
  if (fComp0 == 0) {
    local_34 = Kit_TruthWordNum(nVars);
    while (local_34 = local_34 + -1, -1 < local_34) {
      pOut[local_34] =
           pIn0[local_34] & (pCtrl[local_34] ^ 0xffffffff) | pIn1[local_34] & pCtrl[local_34];
    }
  }
  else {
    local_34 = Kit_TruthWordNum(nVars);
    while (local_34 = local_34 + -1, -1 < local_34) {
      pOut[local_34] =
           (pIn0[local_34] ^ 0xffffffff) & (pCtrl[local_34] ^ 0xffffffff) |
           pIn1[local_34] & pCtrl[local_34];
    }
  }
  return;
}

Assistant:

static inline void Kit_TruthMuxPhase( unsigned * pOut, unsigned * pIn0, unsigned * pIn1, unsigned * pCtrl, int nVars, int fComp0 )
{
    int w;
    if ( fComp0 )
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = (~pIn0[w] & ~pCtrl[w]) | (pIn1[w] & pCtrl[w]);
    else
        for ( w = Kit_TruthWordNum(nVars)-1; w >= 0; w-- )
            pOut[w] = (pIn0[w] & ~pCtrl[w]) | (pIn1[w] & pCtrl[w]);
}